

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild)

{
  ushort *puVar1;
  byte bVar2;
  u8 *puVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  u8 *puVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  int rc;
  int local_70;
  int local_60;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pPage->nOverflow == '\0') && (uVar5 = sz + 2, (int)uVar5 <= pPage->nFree)) {
    iVar6 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar6 == 0) {
      puVar3 = pPage->aData;
      uVar12 = (ulong)pPage->hdrOffset;
      local_3c = 0;
      uVar9 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
      uVar4 = *(ushort *)(puVar3 + uVar12 + 5) << 8 | *(ushort *)(puVar3 + uVar12 + 5) >> 8;
      uVar13 = (uint)uVar4;
      if (uVar4 < uVar9) {
        if ((uVar13 == 0) && (uVar13 = 0x10000, pPage->pBt->usableSize == 0x10000))
        goto LAB_00159c33;
        uVar10 = 0x11bb1;
LAB_00159c27:
        local_70 = 0;
        iVar6 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      }
      else {
        if ((int)pPage->pBt->usableSize < (int)uVar13) {
          uVar10 = 0x11bb4;
          goto LAB_00159c27;
        }
LAB_00159c33:
        if (((puVar3[uVar12 + 2] != '\0') || (local_70 = 0, puVar3[uVar12 + 1] != '\0')) &&
           (local_70 = 0, uVar9 + 2 <= uVar13)) {
          puVar8 = pageFindSlot(pPage,sz,&local_3c);
          if (puVar8 == (u8 *)0x0) {
            bVar14 = local_3c == 0;
            local_70 = 0;
            iVar6 = local_3c;
          }
          else {
            local_60 = (int)puVar3;
            local_70 = (int)puVar8 - local_60;
            if ((int)uVar9 < local_70) {
              iVar6 = 0;
            }
            else {
              iVar6 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11bc5,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            }
            bVar14 = false;
          }
          if (!bVar14) goto LAB_00159d75;
        }
        if ((int)uVar13 < (int)(sz + uVar9 + 2)) {
          iVar7 = pPage->nFree - uVar5;
          iVar6 = 4;
          if (iVar7 < 4) {
            iVar6 = iVar7;
          }
          iVar6 = defragmentPage(pPage,iVar6);
          local_3c = iVar6;
          if (iVar6 != 0) goto LAB_00159d75;
          uVar13 = (((uint)puVar3[uVar12 + 5] * 0x100 + (uint)puVar3[uVar12 + 6]) - 1 & 0xffff) + 1;
        }
        local_70 = uVar13 - sz;
        *(ushort *)(puVar3 + uVar12 + 5) = (ushort)local_70 << 8 | (ushort)local_70 >> 8;
        iVar6 = 0;
      }
LAB_00159d75:
      if (iVar6 != 0) goto LAB_00159d7a;
      pPage->nFree = pPage->nFree - (uVar5 & 0xffff);
      memcpy((uint *)((long)(puVar3 + local_70) + 4),pCell + 4,(long)(sz + -4));
      *(Pgno *)(puVar3 + local_70) =
           iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
      lVar11 = (long)i;
      puVar1 = (ushort *)(pPage->aCellIdx + lVar11 * 2);
      memmove(puVar1 + 1,pPage->aCellIdx + lVar11 * 2,((ulong)pPage->nCell - lVar11) * 2);
      uVar4 = (ushort)local_70 << 8 | (ushort)local_70 >> 8;
      iVar6 = (int)CONCAT62((int6)(short)((uint)local_70 >> 0x10),uVar4);
      *puVar1 = uVar4;
      pPage->nCell = pPage->nCell + 1;
      puVar8 = puVar3 + (ulong)pPage->hdrOffset + 4;
      *puVar8 = *puVar8 + '\x01';
      if (*puVar8 == '\0') {
        puVar3[(ulong)pPage->hdrOffset + 3] = puVar3[(ulong)pPage->hdrOffset + 3] + '\x01';
      }
      if (pPage->pBt->autoVacuum == '\0') {
        bVar14 = true;
      }
      else {
        local_3c = 0;
        ptrmapPutOvflPtr(pPage,pPage,pCell,&local_3c);
        bVar14 = local_3c == 0;
        iVar6 = local_3c;
      }
    }
    else {
LAB_00159d7a:
      bVar14 = false;
    }
    if (!bVar14) goto LAB_00159b3b;
  }
  else {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      pCell = pTemp;
    }
    *(Pgno *)pCell =
         iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = pCell;
    pPage->aiOvfl[bVar2] = (u16)i;
  }
  iVar6 = 0;
LAB_00159b3b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild       /* If non-zero, replace first 4 bytes with this value */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sz==pPage->xCellSize(pPage, pCell) || CORRUPT_DB );
  assert( pPage->nFree>=0 );
  assert( iChild>0 );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    put4byte(pCell, iChild);
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( NEVER(rc!=SQLITE_OK) ){
      return rc;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ return rc; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    /* In a corrupt database where an entry in the cell index section of
    ** a btree page has a value of 3 or less, the pCell value might point
    ** as many as 4 bytes in front of the start of the aData buffer for
    ** the source page.  Make sure this does not cause problems by not
    ** reading the first 4 bytes */
    memcpy(&data[idx+4], pCell+4, sz-4);
    put4byte(&data[idx], iChild);
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      int rc2 = SQLITE_OK;
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, &rc2);
      if( rc2 ) return rc2;
    }
#endif
  }
  return SQLITE_OK;
}